

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
* __thiscall
LongReadsMapper::filter_mappings_by_size_and_id
          (vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           *__return_storage_ptr__,LongReadsMapper *this,int64_t size,float id)

{
  vector<LongReadMapping,std::allocator<LongReadMapping>> *this_00;
  LongReadMapping *pLVar1;
  iterator __position;
  sgNodeID_t sVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  int32_t iVar7;
  long lVar8;
  LongReadMapping *m;
  LongReadMapping *__args;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::resize(__return_storage_ptr__,
           (long)(this->datastore->read_to_fileRecord).
                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->datastore->read_to_fileRecord).
                 super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4);
  pLVar1 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->mappings).
                super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                super__Vector_impl_data._M_start; __args != pLVar1; __args = __args + 1) {
    lVar8 = (long)__args->nEnd - (long)__args->nStart;
    if ((size <= lVar8) && (id <= ((float)__args->score * 100.0) / (float)(int)lVar8)) {
      this_00 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + __args->read_id);
      __position._M_current = *(LongReadMapping **)(this_00 + 8);
      if (__position._M_current == *(LongReadMapping **)(this_00 + 0x10)) {
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        _M_realloc_insert<LongReadMapping_const&>(this_00,__position,__args);
      }
      else {
        sVar2 = __args->node;
        uVar6 = __args->read_id;
        iVar7 = __args->nStart;
        iVar3 = __args->qStart;
        iVar4 = __args->qEnd;
        iVar5 = __args->score;
        (__position._M_current)->nEnd = __args->nEnd;
        (__position._M_current)->qStart = iVar3;
        (__position._M_current)->qEnd = iVar4;
        (__position._M_current)->score = iVar5;
        (__position._M_current)->node = sVar2;
        (__position._M_current)->read_id = uVar6;
        (__position._M_current)->nStart = iVar7;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x20;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<LongReadMapping>> LongReadsMapper::filter_mappings_by_size_and_id(int64_t size, float id) const {
    std::vector<std::vector<LongReadMapping>> filtered_read_mappings;
    filtered_read_mappings.resize(datastore.size()+1);
    for (auto &m:mappings){
        if (m.nEnd-m.nStart>=size and 100.0*m.score/(m.nEnd-m.nStart)>=id){
            filtered_read_mappings[m.read_id].emplace_back(m);
        }
    }
    return filtered_read_mappings;
}